

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priest.c
# Opt level: O3

void ghod_hitsu(monst *priest)

{
  char bx;
  char by;
  level *plVar1;
  char cVar2;
  boolean bVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  int dy;
  char *pcVar7;
  char cVar8;
  level *plVar9;
  char *line;
  char cVar10;
  xchar xVar11;
  
  plVar1 = level;
  if (u.urooms[0] != '\0') {
    pcVar7 = u.urooms;
    cVar2 = u.urooms[0];
    do {
      pcVar7 = pcVar7 + 1;
      if (*(char *)((long)level->monsters + (long)cVar2 * 0xd8 + 0x335c) == '\n') {
        bVar3 = has_shrine(priest);
        if (bVar3 == '\0') {
          return;
        }
        bx = priest->field_0x76;
        by = priest->field_0x77;
        plVar9 = plVar1;
        cVar10 = bx;
        cVar4 = by;
        if ((u.uy == by && u.ux == bx) ||
           (bVar3 = linedup(u.ux,u.uy,bx,by), plVar9 = level, cVar10 = u.ux, cVar4 = u.uy,
           cVar8 = bx, xVar11 = by, bVar3 == '\0')) {
          pcVar7 = (char *)((long)plVar1->monsters + (long)cVar2 * 0xd8 + 0x3358);
          if (plVar9->locations[cVar10][cVar4].typ == '\x17') {
            cVar8 = pcVar7[1];
            xVar11 = cVar4;
            if ((*pcVar7 + -1 != (int)cVar10) &&
               (iVar6 = (int)cVar8, cVar8 = *pcVar7, iVar6 + 1 != (int)cVar10)) {
              cVar8 = cVar10;
              xVar11 = pcVar7[3];
              if ((pcVar7[2] + -1 != (int)cVar4) &&
                 (cVar8 = bx, xVar11 = by, pcVar7[3] + 1 == (int)cVar4)) {
                cVar8 = cVar10;
                xVar11 = pcVar7[2];
              }
            }
          }
          else {
            uVar5 = mt_random();
            cVar8 = u.ux;
            xVar11 = u.uy;
            switch(uVar5 & 3) {
            case 0:
              xVar11 = pcVar7[2];
              break;
            case 1:
              xVar11 = pcVar7[3];
              break;
            case 2:
              cVar8 = *pcVar7;
              break;
            case 3:
              cVar8 = pcVar7[1];
            }
          }
          bVar3 = linedup(u.ux,u.uy,cVar8,xVar11);
          if (bVar3 == '\0') {
            return;
          }
        }
        uVar5 = mt_random();
        pcVar7 = a_gname_at(bx,by);
        if (uVar5 % 3 == 1) {
          pcVar7 = s_suffix(pcVar7);
          line = "%s voice booms:  \"How darest thou harm my servant!\"";
        }
        else if (uVar5 % 3 == 0) {
          line = "%s roars in anger:  \"Thou shalt suffer!\"";
        }
        else {
          line = "%s roars:  \"Thou dost profane my shrine!\"";
        }
        pline(line,pcVar7);
        iVar6 = sgn((int)tbx);
        dy = sgn((int)tby);
        buzz(-0xf,6,cVar8,xVar11,iVar6,dy);
        exercise(2,'\0');
        return;
      }
      cVar2 = *pcVar7;
    } while (cVar2 != '\0');
  }
  return;
}

Assistant:

void ghod_hitsu(struct monst *priest)
{
	int x, y, ax, ay, roomno = (int)temple_occupied(u.urooms);
	struct mkroom *troom;

	if (!roomno || !has_shrine(priest))
		return;

	ax = x = EPRI(priest)->shrpos.x;
	ay = y = EPRI(priest)->shrpos.y;
	troom = &level->rooms[roomno - ROOMOFFSET];

	if ((u.ux == x && u.uy == y) || !linedup(u.ux, u.uy, x, y)) {
	    if (IS_DOOR(level->locations[u.ux][u.uy].typ)) {

		if (u.ux == troom->lx - 1) {
		    x = troom->hx;
		    y = u.uy;
		} else if (u.ux == troom->hx + 1) {
		    x = troom->lx;
		    y = u.uy;
		} else if (u.uy == troom->ly - 1) {
		    x = u.ux;
		    y = troom->hy;
		} else if (u.uy == troom->hy + 1) {
		    x = u.ux;
		    y = troom->ly;
		}
	    } else {
		switch(rn2(4)) {
		case 0:  x = u.ux; y = troom->ly; break;
		case 1:  x = u.ux; y = troom->hy; break;
		case 2:  x = troom->lx; y = u.uy; break;
		default: x = troom->hx; y = u.uy; break;
		}
	    }
	    if (!linedup(u.ux, u.uy, x, y)) return;
	}

	switch(rn2(3)) {
	case 0:
	    pline("%s roars in anger:  \"Thou shalt suffer!\"",
			a_gname_at(ax, ay));
	    break;
	case 1:
	    pline("%s voice booms:  \"How darest thou harm my servant!\"",
			s_suffix(a_gname_at(ax, ay)));
	    break;
	default:
	    pline("%s roars:  \"Thou dost profane my shrine!\"",
			a_gname_at(ax, ay));
	    break;
	}

	buzz(-10-(AD_ELEC-1), 6, x, y, sgn(tbx), sgn(tby)); /* bolt of lightning */
	exercise(A_WIS, FALSE);
}